

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall
Selector::addListener
          (Selector *this,int fd,short events,SelectorListener *listener,jh_ptr_int_t private_data)

{
  Node *pNVar1;
  ListenerNode *pLVar2;
  Node *pNVar3;
  AutoLock l;
  AutoLock AStack_48;
  
  pLVar2 = (ListenerNode *)
           operator_new(0x18,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                        ,0x68);
  pLVar2->mFd = fd;
  pLVar2->mEvents = events;
  pLVar2->mListener = listener;
  pLVar2->mPrivateData = private_data;
  AutoLock::AutoLock(&AStack_48,&this->mLock);
  pNVar3 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar3->val = pLVar2;
  pNVar1 = (this->mList).mTail;
  pNVar3->prev = pNVar1->prev;
  pNVar3->next = pNVar1;
  pNVar1->prev->next = pNVar3;
  pNVar1->prev = pNVar3;
  updateListeners(this);
  AutoLock::~AutoLock(&AStack_48);
  return;
}

Assistant:

void Selector::addListener( int fd, short events, SelectorListener *listener, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	ListenerNode *node = jh_new ListenerNode();
	
	node->mFd = fd;
	node->mEvents = events;
	node->mListener = listener;
	node->mPrivateData = private_data;
	
	AutoLock l( mLock );
	
	mList.push_back( node );	
	updateListeners();	
	
	LOG( "added fd %d events %x, list size %d", fd, events, mList.size() );
}